

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall
capnp::JsonCodec::AnnotatedEnumHandler::AnnotatedEnumHandler
          (AnnotatedEnumHandler *this,EnumSchema schema)

{
  StringPtr *pSVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  AnnotatedEnumHandler *pAVar4;
  WirePointer *pWVar5;
  StructPointerCount SVar6;
  EnumSchema EVar7;
  ElementCount EVar8;
  ArrayPtr<const_char> *pAVar9;
  size_t sVar10;
  ulong capacity;
  ElementCount index;
  ElementCount index_00;
  SegmentReader *pSVar11;
  ArrayPtr<const_char> AVar12;
  Reader anno;
  ArrayBuilder<kj::StringPtr> builder;
  Enumerant e;
  EnumerantList enumerants;
  ArrayPtr<const_char> *local_1c0;
  StructReader local_198;
  ArrayPtr<const_char> *local_168;
  ArrayPtr<const_char> *pAStack_160;
  ArrayPtr<const_char> *local_158;
  undefined8 *local_150;
  PointerReader local_148;
  AnnotatedEnumHandler *local_120;
  CapTableReader *local_118;
  RawBrandedSchema *local_110;
  size_t local_108;
  StructReader local_100;
  ArrayPtr<const_char> local_d0;
  WirePointer *local_c0;
  ElementCount local_b8;
  Schema local_a0;
  StructReader local_98;
  EnumerantList local_68;
  
  (this->super_Handler<capnp::DynamicEnum,_(capnp::Style)0>).super_HandlerBase._vptr_HandlerBase =
       (_func_int **)&PTR_encodeBase_002be788;
  (this->schema).super_Schema.raw = (RawBrandedSchema *)schema.super_Schema.raw;
  (this->nameToValue).table.indexes.erasedCount = 0;
  (this->nameToValue).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->nameToValue).table.indexes.buckets.size_ = 0;
  (this->nameToValue).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->valueToName).ptr = (StringPtr *)0x0;
  (this->valueToName).size_ = 0;
  (this->valueToName).disposer = (ArrayDisposer *)0x0;
  (this->nameToValue).table.rows.builder.ptr = (Entry *)0x0;
  (this->nameToValue).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *)0x0;
  (this->nameToValue).table.rows.builder.endPtr = (Entry *)0x0;
  local_a0 = schema.super_Schema.raw;
  EnumSchema::getEnumerants(&local_68,(EnumSchema *)&local_a0);
  capacity = (ulong)local_68.list.reader.elementCount;
  local_120 = this;
  pAVar9 = (ArrayPtr<const_char> *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x10,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_158 = pAVar9 + capacity;
  local_150 = &kj::_::HeapArrayDisposer::instance;
  local_1c0 = pAVar9;
  if (local_68.list.reader.elementCount != 0) {
    index_00 = 0;
    local_168 = pAVar9;
    pAStack_160 = pAVar9;
    do {
      EVar7.super_Schema.raw = (Schema)(Schema)local_68.parent;
      capnp::_::ListReader::getStructElement(&local_100,&local_68.list.reader,index_00);
      EVar8 = local_100.nestingLimit;
      SVar6 = local_100.pointerCount;
      pWVar5 = local_100.pointers;
      pSVar11 = local_100.segment;
      local_110 = (RawBrandedSchema *)EVar7.super_Schema.raw;
      local_108 = CONCAT62(local_108._2_6_,(short)index_00);
      local_118 = local_100.capTable;
      local_d0.size_ = (size_t)local_100.capTable;
      local_c0 = local_100.pointers;
      local_d0.ptr = (char *)local_100.segment;
      local_b8 = local_100.nestingLimit;
      if (local_100.pointerCount == 0) {
        local_d0.size_ = (size_t)(CapTableReader *)0x0;
        local_c0 = (WirePointer *)0x0;
        local_d0.ptr = (char *)(SegmentReader *)0x0;
        local_b8 = 0x7fffffff;
      }
      AVar12 = (ArrayPtr<const_char>)
               capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&local_d0,(void *)0x0,0);
      if (SVar6 < 2) {
        EVar8 = 0x7fffffff;
        local_198.capTable = (CapTableReader *)0x0;
        local_198.data = (WirePointer *)0x0;
        pSVar11 = (SegmentReader *)0x0;
      }
      else {
        local_198.data = pWVar5 + 1;
        local_198.capTable = local_118;
      }
      local_198.segment = pSVar11;
      local_198.pointers._0_4_ = EVar8;
      capnp::_::PointerReader::getList
                ((ListReader *)&local_d0,(PointerReader *)&local_198,INLINE_COMPOSITE,(word *)0x0);
      EVar8 = local_b8;
      if (local_b8 != 0) {
        index = 0;
        do {
          capnp::_::ListReader::getStructElement(&local_198,(ListReader *)&local_d0,index);
          if ((0x3f < local_198.dataSize) && (*local_198.data == (WirePointer)0xfa5b1fd61c2e7c3d)) {
            local_148.pointer =
                 (WirePointer *)CONCAT44(local_198.pointers._4_4_,(ElementCount)local_198.pointers);
            local_148.nestingLimit = local_198.nestingLimit;
            if (local_198.pointerCount == 0) {
              local_148.pointer = (WirePointer *)0x0;
              local_148.nestingLimit = 0x7fffffff;
            }
            local_148.segment._0_4_ = 0;
            local_148.segment._4_4_ = 0;
            local_148.capTable._0_4_ = 0;
            local_148.capTable._4_4_ = 0;
            if (local_198.pointerCount != 0) {
              local_148.segment._0_4_ = local_198.segment._0_4_;
              local_148.segment._4_4_ = local_198.segment._4_4_;
              local_148.capTable._0_4_ = local_198.capTable._0_4_;
              local_148.capTable._4_4_ = local_198.capTable._4_4_;
            }
            capnp::_::PointerReader::getStruct(&local_98,&local_148,(word *)0x0);
            local_148.nestingLimit = local_98.nestingLimit;
            local_148.pointer = local_98.pointers;
            if (local_98.pointerCount == 0) {
              local_148.pointer = (WirePointer *)0x0;
              local_148.nestingLimit = 0x7fffffff;
            }
            local_148.segment._0_4_ = 0;
            local_148.segment._4_4_ = 0;
            local_148.capTable._0_4_ = 0;
            local_148.capTable._4_4_ = 0;
            if (local_98.pointerCount != 0) {
              local_148.segment._0_4_ = local_98.segment._0_4_;
              local_148.segment._4_4_ = local_98.segment._4_4_;
              local_148.capTable._0_4_ = local_98.capTable._0_4_;
              local_148.capTable._4_4_ = local_98.capTable._4_4_;
            }
            AVar12 = (ArrayPtr<const_char>)
                     capnp::_::PointerReader::getBlob<capnp::Text>(&local_148,(void *)0x0,0);
          }
          index = index + 1;
        } while (EVar8 != index);
      }
      *local_1c0 = AVar12;
      local_1c0 = local_1c0 + 1;
      local_c0 = (WirePointer *)CONCAT62(local_c0._2_6_,(undefined2)local_108);
      pAStack_160 = local_1c0;
      local_d0 = AVar12;
      kj::
      Table<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>_>
      ::insert(&(this->nameToValue).table,(Entry *)&local_d0);
      index_00 = index_00 + 1;
    } while (index_00 != local_68.list.reader.elementCount);
  }
  pAVar4 = local_120;
  sVar10 = (long)local_1c0 - (long)pAVar9 >> 4;
  local_100.segment = (SegmentReader *)&kj::_::HeapArrayDisposer::instance;
  local_168 = (ArrayPtr<const_char> *)0x0;
  pAStack_160 = (ArrayPtr<const_char> *)0x0;
  local_158 = (ArrayPtr<const_char> *)0x0;
  pSVar1 = (this->valueToName).ptr;
  if (pSVar1 != (StringPtr *)0x0) {
    sVar2 = (local_120->valueToName).size_;
    (this->valueToName).ptr = (StringPtr *)0x0;
    (this->valueToName).size_ = 0;
    pAVar3 = (local_120->valueToName).disposer;
    local_110 = (RawBrandedSchema *)pAVar9;
    local_108 = sVar10;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pSVar1,0x10,sVar2,sVar2,0);
  }
  (pAVar4->valueToName).ptr = (StringPtr *)pAVar9;
  (pAVar4->valueToName).size_ = sVar10;
  (pAVar4->valueToName).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return;
}

Assistant:

AnnotatedEnumHandler(EnumSchema schema): schema(schema) {
    auto enumerants = schema.getEnumerants();
    auto builder = kj::heapArrayBuilder<kj::StringPtr>(enumerants.size());

    for (auto e: enumerants) {
      auto proto = e.getProto();
      kj::StringPtr name = proto.getName();

      for (auto anno: proto.getAnnotations()) {
        switch (anno.getId()) {
          case JSON_NAME_ANNOTATION_ID:
            name = anno.getValue().getText();
            break;
        }
      }

      builder.add(name);
      nameToValue.insert(name, e.getIndex());
    }

    valueToName = builder.finish();
  }